

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void http_server_close(http_server_t *server)

{
  int __fd;
  long lVar1;
  ulong uVar2;
  
  if (server != (http_server_t *)0x0) {
    if (server->clients != (http_client_t *)0x0) {
      if (server->num_clients != 0) {
        lVar1 = 0;
        uVar2 = 0;
        do {
          __fd = *(int *)(server->clients->buf + lVar1 + -0x10);
          if (__fd != -1) {
            close(__fd);
          }
          uVar2 = uVar2 + 1;
          lVar1 = lVar1 + 0x2018;
        } while (uVar2 < server->num_clients);
      }
      free(server->clients);
    }
    server->clients = (http_client_t *)0x0;
    server->num_clients = 0;
    server->count_clients = 0;
    server->max_clients = 0;
    if (server->fd != -1) {
      close(server->fd);
    }
    server->fd = -1;
    server->callback = (http_client_callback_t *)0x0;
    return;
  }
  __assert_fail("server != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/http.c",0x48,
                "void http_server_close(http_server_t *)");
}

Assistant:

void http_server_close(http_server_t *server) {
  assert(server != NULL);

  if (server->clients != NULL) {
    unsigned int i;
    for (i = 0; i < server->num_clients; i++) {
      if (server->clients[i].fd != -1) {
        close(server->clients[i].fd);
      }
    }
    free(server->clients);
  }
  server->clients       = NULL;
  server->num_clients   = 0;
  server->count_clients = 0;
  server->max_clients   = 0;
  
  if (server->fd != -1)
    close(server->fd);
  server->fd = -1;

  server->callback = NULL;
}